

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNodeList.h
# Opt level: O1

Action __thiscall
psy::C::
CoreSyntaxNodeList<psy::C::InitializerSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::InitializerSyntax_*>_>
::acceptVisitor(CoreSyntaxNodeList<psy::C::InitializerSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::InitializerSyntax_*>_>
                *this,SyntaxVisitor *visitor)

{
  SyntaxNode *this_00;
  Action AVar1;
  CoreSyntaxNodeList<psy::C::InitializerSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::InitializerSyntax_*>_>
  *it;
  
  while ((this_00 = &((((SyntaxNodeSeparatedList<psy::C::InitializerSyntax_*> *)this)->
                      super_CoreSyntaxNodeList<psy::C::InitializerSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::InitializerSyntax_*>_>
                      ).
                      super_List<psy::C::InitializerSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::InitializerSyntax_*>_>
                     .value)->super_SyntaxNode, this_00 == (SyntaxNode *)0x0 ||
         (AVar1 = SyntaxNode::acceptVisitor(this_00,visitor), AVar1 != Quit))) {
    this = &((((SyntaxNodeSeparatedList<psy::C::InitializerSyntax_*> *)this)->
             super_CoreSyntaxNodeList<psy::C::InitializerSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::InitializerSyntax_*>_>
             ).
             super_List<psy::C::InitializerSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::InitializerSyntax_*>_>
            .next)->
            super_CoreSyntaxNodeList<psy::C::InitializerSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::InitializerSyntax_*>_>
    ;
    if ((SyntaxNodeSeparatedList<psy::C::InitializerSyntax_*> *)this ==
        (SyntaxNodeSeparatedList<psy::C::InitializerSyntax_*> *)0x0) {
      return Visit;
    }
  }
  return Quit;
}

Assistant:

virtual SyntaxVisitor::Action acceptVisitor(SyntaxVisitor* visitor) override
    {
        for (auto it = this; it; it = it->next) {
            SyntaxNodeT node = static_cast<SyntaxNodeT>(it->value);
            if (node) {
                auto action = node->acceptVisitor(visitor);
                if (action == SyntaxVisitor::Action::Quit)
                    return action;
            }
        }
        return SyntaxVisitor::Action::Visit;
    }